

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O0

Image * __thiscall VideoEngine::makeScreenshot(Image *__return_storage_ptr__,VideoEngine *this)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  uchar *puVar4;
  allocator<unsigned_char> local_32;
  value_type_conflict3 local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  VideoEngine *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar1 = Canvas::width(pCVar3);
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar2 = Canvas::height(pCVar3);
  local_31 = '\0';
  std::allocator<unsigned_char>::allocator(&local_32);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
             (long)(iVar1 * iVar2 * 3),&local_31,&local_32);
  std::allocator<unsigned_char>::~allocator(&local_32);
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar1 = Canvas::width(pCVar3);
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar2 = Canvas::height(pCVar3);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  glReadPixels(0,0,iVar1,iVar2,0x1907,0x1401,puVar4);
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar1 = Canvas::width(pCVar3);
  __return_storage_ptr__->w = iVar1;
  pCVar3 = std::unique_ptr<VideoEngine::Canvas,_std::default_delete<VideoEngine::Canvas>_>::
           operator->(&this->canvas_);
  iVar1 = Canvas::height(pCVar3);
  __return_storage_ptr__->h = iVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&__return_storage_ptr__->data,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Image VideoEngine::makeScreenshot() const {
	std::vector<unsigned char> data((size_t)(canvas_->width() * canvas_->height() * 3), 0);
	glReadPixels(0, 0, canvas_->width(), canvas_->height(), GL_RGB, GL_UNSIGNED_BYTE, data.data());
	return Image{canvas_->width(), canvas_->height(), std::move(data)};
}